

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpageranges.cpp
# Opt level: O3

QPageRanges __thiscall QPageRanges::fromString(QPageRanges *this,QString *ranges)

{
  int iVar1;
  qsizetype qVar2;
  long lVar3;
  long lVar4;
  QPageRangesPrivate *ptr;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  bool ok_1;
  bool ok;
  Range local_a4;
  bool local_99;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QPageRanges::Range> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (Range *)0x0;
  local_58.size = 0;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  QString::split(&local_78,ranges,0x2c,0,1);
  if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
    lVar6 = CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
    lVar5 = local_78.size * 0x18;
    do {
      if (*(Data **)(lVar6 + 0x10) == (Data *)0x0) goto LAB_003ac5af;
      local_98.ptr = *(QString **)(lVar6 + 8);
      local_98.d = *(Data **)(lVar6 + 0x10);
      qVar2 = QStringView::indexOf((QStringView *)&local_98,(QChar)0x2d,0,CaseSensitive);
      if (qVar2 != -1) {
        local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        QString::split(&local_98,lVar6,0x2d,0,1);
        if ((undefined1 *)local_98.size == (undefined1 *)0x2) {
          local_99 = true;
          QVar7.m_data = ((local_98.ptr)->d).ptr;
          QVar7.m_size = ((local_98.ptr)->d).size;
          lVar3 = QString::toIntegral_helper(QVar7,&local_99,10);
          if ((int)(uint)lVar3 == lVar3) {
            if ((local_99 & 1U) != 0) {
              QVar8.m_data = local_98.ptr[1].d.ptr;
              QVar8.m_size = local_98.ptr[1].d.size;
              lVar4 = QString::toIntegral_helper(QVar8,&local_99,10);
              if ((int)lVar4 != lVar4) goto LAB_003ac591;
              if (((((local_99 & 1U) != 0) && (lVar3 <= lVar4)) && (0 < lVar3)) && (0 < lVar4)) {
                local_a4.from = (uint)lVar3;
                local_a4.to = (int)lVar4;
                QtPrivate::QMovableArrayOps<QPageRanges::Range>::emplace<QPageRanges::Range>
                          ((QMovableArrayOps<QPageRanges::Range> *)&local_58,local_58.size,&local_a4
                          );
                QList<QPageRanges::Range>::end((QList<QPageRanges::Range> *)&local_58);
                QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
                goto LAB_003ac529;
              }
            }
          }
          else {
LAB_003ac591:
            local_99 = false;
          }
        }
        QPageRanges(this);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
        goto LAB_003ac5b7;
      }
      local_a4.from = CONCAT31(local_a4.from._1_3_,0xaa);
      QVar9.m_data = *(storage_type_conflict **)(lVar6 + 8);
      QVar9.m_size = *(qsizetype *)(lVar6 + 0x10);
      lVar3 = QString::toIntegral_helper(QVar9,(bool *)&local_a4,10);
      iVar1 = (int)lVar3;
      if (iVar1 != lVar3) {
        local_a4.from = local_a4.from & 0xffffff00;
LAB_003ac5af:
        QPageRanges(this);
        goto LAB_003ac5b7;
      }
      if ((lVar3 < 1) || ((local_a4.from & 1U) == 0)) goto LAB_003ac5af;
      local_98.d = (Data *)CONCAT44(iVar1,iVar1);
      QtPrivate::QMovableArrayOps<QPageRanges::Range>::emplace<QPageRanges::Range>
                ((QMovableArrayOps<QPageRanges::Range> *)&local_58,local_58.size,(Range *)&local_98)
      ;
      QList<QPageRanges::Range>::end((QList<QPageRanges::Range> *)&local_58);
LAB_003ac529:
      lVar6 = lVar6 + 0x18;
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != 0);
  }
  (this->d).d.ptr = (QPageRangesPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QPageRanges(this);
  ptr = (QPageRangesPrivate *)operator_new(0x20);
  (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  (ptr->intervals).d.d = (Data *)0x0;
  (ptr->intervals).d.ptr = (Range *)0x0;
  (ptr->intervals).d.size = 0;
  QExplicitlySharedDataPointer<QPageRangesPrivate>::reset(&this->d,ptr);
  QArrayDataPointer<QPageRanges::Range>::operator=(&(((this->d).d.ptr)->intervals).d,&local_58);
  QPageRangesPrivate::mergeIntervals((this->d).d.ptr);
LAB_003ac5b7:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QPageRangesPrivate>)
           (QExplicitlySharedDataPointer<QPageRangesPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QPageRanges QPageRanges::fromString(const QString &ranges)
{
    QList<Range> intervals;
    const QStringList items = ranges.split(u',');
    for (const QString &item : items) {
        if (item.isEmpty())
            return QPageRanges();

        if (item.contains(u'-')) {
            const QStringList rangeItems = item.split(u'-');
            if (rangeItems.size() != 2)
                return QPageRanges();

            bool ok;
            const int number1 = rangeItems[0].toInt(&ok);
            if (!ok)
                return QPageRanges();

            const int number2 = rangeItems[1].toInt(&ok);
            if (!ok)
                return QPageRanges();

            if (number1 < 1 || number2 < 1 || number2 < number1)
                return QPageRanges();

            intervals.append({number1, number2});

        } else {
            bool ok;
            const int number = item.toInt(&ok);
            if (!ok)
                return QPageRanges();

            if (number < 1)
                return QPageRanges();

            intervals.append({number, number});
        }
    }

    QPageRanges newRanges;
    newRanges.d.reset(new QPageRangesPrivate);
    newRanges.d->intervals = intervals;
    newRanges.d->mergeIntervals();
    return newRanges;
}